

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::updateIsOpaque(QWidgetPrivate *this)

{
  QWidget *this_00;
  long lVar1;
  char cVar2;
  uint uVar3;
  QPalette *pQVar4;
  long *plVar5;
  
  setDirtyOpaqueRegion(this);
  if (this->graphicsEffect == (QGraphicsEffect *)0x0) {
    this_00 = *(QWidget **)&this->field_0x8;
    if ((this_00->data->widget_attributes & 0x110) != 0) {
LAB_002f64df:
      if ((*(uint *)&this->field_0x250 >> 0x11 & 1) != 0) {
        return;
      }
      uVar3 = *(uint *)&this->field_0x250 | 0x20000;
      goto LAB_002f64f0;
    }
    pQVar4 = QWidget::palette(this_00);
    lVar1 = *(long *)(*(long *)&this_00->field_0x8 + 0x78);
    if ((lVar1 != 0) && ((*(byte *)(lVar1 + 0x7c) & 0x10) != 0)) {
      QWidget::backgroundRole(this_00);
      plVar5 = (long *)QPalette::brush((ColorGroup)pQVar4,Dark);
      if ((*(int *)(*plVar5 + 4) != 0) && (cVar2 = QBrush::isOpaque(), cVar2 != '\0'))
      goto LAB_002f64df;
    }
    if ((((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
       ((this_00->data->widget_attributes & 0x200) == 0)) {
      pQVar4 = QWidget::palette(this_00);
      plVar5 = (long *)QPalette::brush((ColorGroup)pQVar4,Dark);
      if ((*(int *)(*plVar5 + 4) != 0) && (cVar2 = QBrush::isOpaque(), cVar2 != '\0'))
      goto LAB_002f64df;
    }
  }
  if ((*(uint *)&this->field_0x250 >> 0x11 & 1) == 0) {
    return;
  }
  uVar3 = *(uint *)&this->field_0x250 & 0xfffdffff;
LAB_002f64f0:
  *(uint *)&this->field_0x250 = uVar3;
  updateIsTranslucent(this);
  return;
}

Assistant:

void QWidgetPrivate::updateIsOpaque()
{
    // hw: todo: only needed if opacity actually changed
    setDirtyOpaqueRegion();

#if QT_CONFIG(graphicseffect)
    if (graphicsEffect) {
        // ### We should probably add QGraphicsEffect::isOpaque at some point.
        setOpaque(false);
        return;
    }
#endif // QT_CONFIG(graphicseffect)

    Q_Q(QWidget);
    if (q->testAttribute(Qt::WA_OpaquePaintEvent) || q->testAttribute(Qt::WA_PaintOnScreen)) {
        setOpaque(true);
        return;
    }

    const QPalette &pal = q->palette();

    if (q->autoFillBackground()) {
        const QBrush &autoFillBrush = pal.brush(q->backgroundRole());
        if (autoFillBrush.style() != Qt::NoBrush && autoFillBrush.isOpaque()) {
            setOpaque(true);
            return;
        }
    }

    if (q->isWindow() && !q->testAttribute(Qt::WA_NoSystemBackground)) {
        const QBrush &windowBrush = q->palette().brush(QPalette::Window);
        if (windowBrush.style() != Qt::NoBrush && windowBrush.isOpaque()) {
            setOpaque(true);
            return;
        }
    }
    setOpaque(false);
}